

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

void IPdr_ManPrintClauses(Vec_Vec_t *vClauses,int kStart,int nRegs)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Pdr_Set_t *p;
  Pdr_Set_t *pPVar4;
  long lVar5;
  ulong uVar6;
  
  if (kStart < vClauses->nSize) {
    uVar6 = (ulong)(uint)kStart;
    iVar2 = 0;
    p = (Pdr_Set_t *)vClauses;
    do {
      if (kStart < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar1 = vClauses->pArray[uVar6];
      iVar3 = *(int *)((long)pvVar1 + 4);
      if (1 < (long)iVar3) {
        p = *(Pdr_Set_t **)((long)pvVar1 + 8);
        qsort(p,(long)iVar3,8,Pdr_SetCompare);
        iVar3 = *(int *)((long)pvVar1 + 4);
      }
      if (0 < iVar3) {
        lVar5 = 0;
        pPVar4 = p;
        do {
          p = *(Pdr_Set_t **)(*(long *)((long)pvVar1 + 8) + lVar5 * 8);
          Abc_Print((int)pPVar4,"Frame[%4d]Cube[%4d] = ",uVar6 & 0xffffffff,
                    (ulong)(uint)(iVar2 + (int)lVar5));
          ZPdr_SetPrint(p);
          Abc_Print((int)p,"\n");
          lVar5 = lVar5 + 1;
          pPVar4 = p;
        } while (lVar5 < *(int *)((long)pvVar1 + 4));
        iVar2 = iVar2 + (int)lVar5;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < vClauses->nSize);
  }
  return;
}

Assistant:

void IPdr_ManPrintClauses( Vec_Vec_t * vClauses, int kStart, int nRegs )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, k, Counter = 0;
    Vec_VecForEachLevelStart( vClauses, vArrayK, k, kStart )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, i )
        {
            Abc_Print( 1, "Frame[%4d]Cube[%4d] = ", k, Counter++ );
            // Pdr_SetPrint( stdout, pCube, nRegs, NULL );  
            ZPdr_SetPrint( pCube );  
            Abc_Print( 1, "\n" ); 
        }
    }
}